

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O1

JavascriptBigInt * Js::JavascriptBigInt::New(JavascriptBigInt *pbi,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  JavascriptBigInt *this;
  unsigned_long *puVar6;
  size_t sizeInBytes;
  ulong uVar7;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  if (pbi->m_maxLength < pbi->m_length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                ,0x26,"(pbi->m_maxLength >= pbi->m_length)",
                                "pbi->m_maxLength >= pbi->m_length");
    if (!bVar2) goto LAB_00d30f92;
    *puVar4 = 0;
  }
  local_60 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_82f5f8c;
  data.filename._0_4_ = 0x27;
  pRVar5 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60);
  this = (JavascriptBigInt *)new<Memory::Recycler>(0x30,pRVar5,0x38bbb2);
  JavascriptBigInt(this,(((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                        bigintTypeStatic).ptr);
  this->m_length = pbi->m_length;
  this->m_maxLength = pbi->m_maxLength;
  this->m_isNegative = pbi->m_isNegative;
  data.plusSize = pbi->m_maxLength;
  local_60 = (undefined1  [8])&unsigned_long::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_82f5f8c;
  data.filename._0_4_ = 0x2b;
  pRVar5 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60);
  uVar7 = pbi->m_maxLength;
  if (uVar7 == 0) {
    Memory::Recycler::ClearTrackAllocInfo(pRVar5,(TrackAllocData *)0x0);
    puVar6 = (unsigned_long *)&DAT_00000008;
  }
  else {
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      data._32_8_ = __tls_get_addr(&PTR_0155fe48);
      *(undefined4 *)data._32_8_ = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00d30f92;
      *(undefined4 *)data._32_8_ = 0;
    }
    uVar7 = -(ulong)(uVar7 >> 0x3d != 0) | uVar7 << 3;
    if (uVar7 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                                  "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
      if (!bVar2) goto LAB_00d30f92;
      *puVar4 = 0;
    }
    puVar6 = (unsigned_long *)
             Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                       (pRVar5,uVar7);
    if (puVar6 == (unsigned_long *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_00d30f92:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  Memory::Recycler::WBSetBit((char *)&this->m_digits);
  (this->m_digits).ptr = puVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->m_digits);
  sizeInBytes = this->m_length << 3;
  js_memcpy_s((this->m_digits).ptr,sizeInBytes,(pbi->m_digits).ptr,sizeInBytes);
  return this;
}

Assistant:

JavascriptBigInt * JavascriptBigInt::New(JavascriptBigInt * pbi, ScriptContext * scriptContext)
    {
        Assert(pbi->m_maxLength >= pbi->m_length);
        JavascriptBigInt * bigintNew = RecyclerNew(scriptContext->GetRecycler(), JavascriptBigInt, scriptContext->GetLibrary()->GetBigIntTypeStatic());
        bigintNew->m_length = pbi->m_length;
        bigintNew->m_maxLength = pbi->m_maxLength;
        bigintNew->m_isNegative = pbi->m_isNegative;
        bigintNew->m_digits = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), digit_t, pbi->m_maxLength);
        js_memcpy_s(bigintNew->m_digits, bigintNew->m_length * sizeof(digit_t), pbi->m_digits, bigintNew->m_length * sizeof(digit_t));
 
        return bigintNew;
    }